

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_fcmlah_idx_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  float16 fVar4;
  float16 fVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  ulong opr_sz_00;
  ulong uVar9;
  uintptr_t max_sz;
  float16 e4;
  float16 e2;
  float16 e3;
  float16 e1;
  float16 mi;
  float16 mr;
  intptr_t j;
  intptr_t i;
  intptr_t eltspersegment;
  intptr_t elements;
  uint32_t neg_real;
  intptr_t index;
  uint32_t neg_imag;
  intptr_t flip;
  float_status *fpst;
  float16 *m;
  float16 *n;
  float16 *d;
  uintptr_t opr_sz;
  uint32_t desc_local;
  void *vfpst_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  uVar6 = extract32(desc,10,1);
  uVar9 = (ulong)uVar6;
  uVar7 = extract32(desc,0xb,1);
  uVar8 = extract32(desc,0xc,2);
  for (j = 0; j < (long)(opr_sz_00 >> 1); j = j + 8) {
    uVar1 = *(ushort *)((long)vm + (j + (ulong)uVar8 * 2) * 2);
    uVar2 = *(ushort *)((long)vm + (j + (ulong)uVar8 * 2) * 2 + 2);
    uVar3 = uVar1;
    if (uVar9 != 0) {
      uVar3 = uVar2;
    }
    if (uVar9 != 0) {
      uVar2 = uVar1;
    }
    for (_e3 = j; _e3 < j + 8; _e3 = _e3 + 2) {
      fVar5 = *(float16 *)((long)vn + (_e3 + uVar9) * 2);
      fVar4 = float16_muladd_arm(fVar5,(ushort)((uVar6 ^ uVar7) << 0xf) ^ uVar3,
                                 *(float16 *)((long)vd + _e3 * 2),0,(float_status *)vfpst);
      *(float16 *)((long)vd + _e3 * 2) = fVar4;
      fVar5 = float16_muladd_arm(fVar5,(ushort)(uVar7 << 0xf) ^ uVar2,
                                 *(float16 *)((long)vd + _e3 * 2 + 2),0,(float_status *)vfpst);
      *(float16 *)((long)vd + _e3 * 2 + 2) = fVar5;
    }
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_fcmlah_idx)(void *vd, void *vn, void *vm,
                             void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float16 *d = vd;
    float16 *n = vn;
    float16 *m = vm;
    float_status *fpst = vfpst;
    intptr_t flip = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    intptr_t index = extract32(desc, SIMD_DATA_SHIFT + 2, 2);
    uint32_t neg_real = flip ^ neg_imag;
    intptr_t elements = opr_sz / sizeof(float16);
    intptr_t eltspersegment = 16 / sizeof(float16);
    intptr_t i, j;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 15;
    neg_imag <<= 15;

    for (i = 0; i < elements; i += eltspersegment) {
        float16 mr = m[H2(i + 2 * index + 0)];
        float16 mi = m[H2(i + 2 * index + 1)];
        float16 e1 = neg_real ^ (flip ? mi : mr);
        float16 e3 = neg_imag ^ (flip ? mr : mi);

        for (j = i; j < i + eltspersegment; j += 2) {
            float16 e2 = n[H2(j + flip)];
            float16 e4 = e2;

            d[H2(j)] = float16_muladd(e2, e1, d[H2(j)], 0, fpst);
            d[H2(j + 1)] = float16_muladd(e4, e3, d[H2(j + 1)], 0, fpst);
        }
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}